

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QNetworkRequest::Attribute,_QVariant> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
findNode<QNetworkRequest::Attribute>
          (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this,Attribute *key)

{
  ulong uVar1;
  Node<QNetworkRequest::Attribute,_QVariant> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QNetworkRequest::Attribute>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QNetworkRequest::Attribute,_QVariant> *)0x0;
  }
  else {
    pNVar2 = (Node<QNetworkRequest::Attribute,_QVariant> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }